

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueAcquireGLObjects
                 (cl_command_queue command_queue,cl_uint num_objects,cl_mem *mem_objects,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  uint64_t enqueueCounter_00;
  CLIntercept *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  undefined1 uVar3;
  cl_icd_dispatch *pcVar4;
  SConfig *pSVar5;
  time_point queuedTime_00;
  undefined8 uVar6;
  cl_uint in_ECX;
  cl_mem *in_RDX;
  cl_uint in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  cl_event *in_R8;
  cl_event *in_R9;
  CLIntercept *in_stack_000000e8;
  time_point toolEnd_1;
  time_point toolStart_1;
  cl_int e;
  time_point toolEnd;
  time_point toolStart;
  time_point cpuEnd;
  time_point cpuStart;
  bool isLocalEvent;
  cl_event local_event;
  time_point queuedTime;
  string eventWaitListString;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLIntercept *pIntercept;
  char *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  _cl_event *in_stack_fffffffffffffb70;
  CObjectTracker *in_stack_fffffffffffffb78;
  allocator *paVar7;
  uint64_t in_stack_fffffffffffffb80;
  CLIntercept *in_stack_fffffffffffffb88;
  CLIntercept *in_stack_fffffffffffffb90;
  CLIntercept *in_stack_fffffffffffffbb8;
  CLIntercept *in_stack_fffffffffffffbc0;
  CLIntercept *in_stack_fffffffffffffbc8;
  cl_event *in_stack_fffffffffffffbd0;
  cl_event p_Var8;
  cl_event *in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffbe0;
  cl_uint numEvents;
  char *in_stack_fffffffffffffbe8;
  CLIntercept *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  undefined1 includeId;
  CObjectTracker *in_stack_fffffffffffffc00;
  SConfig *in_stack_fffffffffffffc08;
  CLIntercept *in_stack_fffffffffffffc10;
  time_point in_stack_fffffffffffffc18;
  time_point in_stack_fffffffffffffc20;
  time_point in_stack_fffffffffffffc28;
  time_point in_stack_fffffffffffffc30;
  undefined6 in_stack_fffffffffffffc60;
  byte in_stack_fffffffffffffc66;
  undefined1 in_stack_fffffffffffffc67;
  allocator *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  SConfig *in_stack_fffffffffffffc78;
  undefined6 in_stack_fffffffffffffc80;
  undefined1 uVar9;
  SConfig *in_stack_fffffffffffffc88;
  SConfig *in_stack_fffffffffffffc90;
  CLIntercept *in_stack_fffffffffffffc98;
  allocator *in_stack_fffffffffffffcb0;
  int local_2b4;
  undefined8 local_2b0;
  undefined8 local_2a8;
  allocator local_299;
  string local_298 [12];
  cl_int in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  cl_int in_stack_fffffffffffffd7c;
  CLIntercept *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  CLIntercept *in_stack_fffffffffffffd90;
  allocator local_261;
  string local_260 [32];
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  allocator local_209;
  string local_208 [32];
  undefined8 local_1e8;
  undefined8 local_1e0;
  allocator local_1d1;
  undefined8 local_190;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  undefined8 local_128;
  byte local_11b;
  byte local_11a;
  allocator local_119;
  string local_118 [32];
  undefined8 local_f8;
  cl_kernel local_f0;
  allocator local_e1;
  string local_e0 [32];
  undefined8 local_c0;
  size_t *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  cl_uint cVar10;
  cl_kernel in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar11;
  CLIntercept *in_stack_ffffffffffffff70;
  undefined8 local_88;
  size_t *in_stack_ffffffffffffff80;
  cl_command_queue in_stack_ffffffffffffff88;
  string local_70 [32];
  uint64_t local_50;
  cl_int local_44;
  CLIntercept *local_40;
  cl_event *local_38;
  cl_event *local_30;
  cl_uint local_24;
  cl_mem *local_20;
  cl_uint local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  cl_int local_4;
  
  includeId = (undefined1)((ulong)in_stack_fffffffffffffbf8 >> 0x38);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  cVar10 = (cl_uint)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_40 = GetIntercept();
  if ((local_40 == (CLIntercept *)0x0) ||
     (pcVar4 = CLIntercept::dispatch(local_40),
     pcVar4->clEnqueueAcquireGLObjects == (cl_api_clEnqueueAcquireGLObjects)0x0)) {
    local_2b4 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_2b4);
    local_4 = -0x24;
  }
  else {
    local_44 = 0;
    local_50 = CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffbc8);
    pSVar5 = CLIntercept::config(local_40);
    if ((((pSVar5->AubCapture & 1U) != 0) &&
        (bVar2 = CLIntercept::checkAubCaptureEnqueueLimits(local_40,local_50), bVar2)) &&
       (pSVar5 = CLIntercept::config(local_40), (pSVar5->AubCaptureIndividualEnqueues & 1U) == 0)) {
      in_stack_fffffffffffffb58 = (char *)0x0;
      in_stack_fffffffffffffb60 = local_10;
      CLIntercept::startAubCapture
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,cVar10,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
    }
    pSVar5 = CLIntercept::config(local_40);
    if ((pSVar5->NullEnqueue & 1U) == 0) {
      getFormattedEventWaitList_abi_cxx11_
                (in_stack_fffffffffffffb88,(cl_uint)(in_stack_fffffffffffffb80 >> 0x20),
                 (cl_event *)in_stack_fffffffffffffb78);
      pSVar5 = CLIntercept::config(local_40);
      pbVar1 = local_10;
      cVar10 = local_14;
      this = local_40;
      enqueueCounter_00 = local_50;
      if ((pSVar5->CallLogging & 1U) != 0) {
        in_stack_fffffffffffffb60 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::c_str();
        in_stack_fffffffffffffb58 =
             (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffb58 >> 0x20),cVar10);
        CLIntercept::callLoggingEnter
                  (this,"clEnqueueAcquireGLObjects",enqueueCounter_00,(cl_kernel)0x0,
                   "queue = %p, num_objects = %u%s",pbVar1);
      }
      pSVar5 = CLIntercept::config(local_40);
      if ((pSVar5->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,numEvents,
                   in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb60);
      bVar11 = 0;
      pSVar5 = CLIntercept::config(local_40);
      if (((((pSVar5->DevicePerformanceTiming & 1U) != 0) ||
           (pSVar5 = CLIntercept::config(local_40), (pSVar5->ITTPerformanceTiming & 1U) != 0)) ||
          ((pSVar5 = CLIntercept::config(local_40), (pSVar5->ChromePerformanceTiming & 1U) != 0 ||
           (pSVar5 = CLIntercept::config(local_40),
           (pSVar5->DevicePerfCounterEventBasedSampling & 1U) != 0)))) &&
         (local_88 = std::chrono::_V2::steady_clock::now(), local_38 == (cl_event *)0x0)) {
        local_38 = (cl_event *)&stack0xffffffffffffff70;
        bVar11 = 1;
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb60);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb60);
      pSVar5 = CLIntercept::config(local_40);
      if (((pSVar5->HostPerformanceTiming & 1U) != 0) ||
         (pSVar5 = CLIntercept::config(local_40), (pSVar5->ChromeCallLogging & 1U) != 0)) {
        in_stack_ffffffffffffff58 = (cl_kernel)std::chrono::_V2::steady_clock::now();
      }
      pcVar4 = CLIntercept::dispatch(local_40);
      local_44 = (*pcVar4->clEnqueueAcquireGLObjects)
                           ((cl_command_queue)local_10,local_14,local_20,local_24,local_30,local_38)
      ;
      pSVar5 = CLIntercept::config(local_40);
      if (((pSVar5->HostPerformanceTiming & 1U) != 0) ||
         (pSVar5 = CLIntercept::config(local_40), (pSVar5->ChromeCallLogging & 1U) != 0)) {
        local_c0 = std::chrono::_V2::steady_clock::now();
        uVar6 = local_c0;
        pSVar5 = CLIntercept::config(local_40);
        if (((pSVar5->HostPerformanceTiming & 1U) != 0) &&
           (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_40,local_50), bVar2))
        {
          in_stack_fffffffffffffcb0 = &local_e1;
          std::allocator<char>::allocator();
          local_f8 = uVar6;
          local_f0 = in_stack_ffffffffffffff58;
          std::__cxx11::string::string(local_e0,"",in_stack_fffffffffffffcb0);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffc20.__d.__r,
                     (char *)in_stack_fffffffffffffc18.__d.__r,(string *)in_stack_fffffffffffffc10,
                     in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        }
      }
      queuedTime_00.__d.__r = (duration)CLIntercept::config(local_40);
      if ((((((((SConfig *)queuedTime_00.__d.__r)->DevicePerformanceTiming & 1U) != 0) ||
            (in_stack_fffffffffffffc98 = (CLIntercept *)CLIntercept::config(local_40),
            ((ulong)(in_stack_fffffffffffffc98->m_Dispatch).clRetainSampler & 0x100000000) != 0)) ||
           (in_stack_fffffffffffffc90 = CLIntercept::config(local_40),
           (in_stack_fffffffffffffc90->ChromePerformanceTiming & 1U) != 0)) ||
          (in_stack_fffffffffffffc88 = CLIntercept::config(local_40),
          (in_stack_fffffffffffffc88->DevicePerfCounterEventBasedSampling & 1U) != 0)) &&
         (local_38 != (cl_event *)0x0)) {
        local_11a = 0;
        local_11b = 0;
        uVar3 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(local_40,local_50);
        in_stack_fffffffffffffc66 = false;
        if ((bool)uVar3) {
          in_stack_fffffffffffffc78 = CLIntercept::config(local_40);
          in_stack_fffffffffffffc77 = true;
          in_stack_fffffffffffffc66 = true;
          if ((in_stack_fffffffffffffc78->DevicePerformanceTimingSkipUnmap & 1U) != 0) {
            in_stack_fffffffffffffc68 = &local_119;
            std::allocator<char>::allocator();
            local_11a = 1;
            std::__cxx11::string::string
                      (local_118,"clEnqueueAcquireGLObjects",in_stack_fffffffffffffc68);
            local_11b = 1;
            in_stack_fffffffffffffc67 =
                 std::operator!=(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
            in_stack_fffffffffffffc77 = in_stack_fffffffffffffc67;
            in_stack_fffffffffffffc66 = in_stack_fffffffffffffc67;
          }
        }
        uVar9 = in_stack_fffffffffffffc66;
        if ((local_11b & 1) != 0) {
          std::__cxx11::string::~string(local_118);
        }
        if ((local_11a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_119);
        }
        if ((in_stack_fffffffffffffc66 & 1) != 0) {
          local_128 = local_88;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_148,"",&local_149);
          CLIntercept::addTimingEvent
                    (in_stack_fffffffffffffc98,&in_stack_fffffffffffffc90->SuppressLogging,
                     (uint64_t)in_stack_fffffffffffffc88,queuedTime_00,
                     (string *)CONCAT17(uVar3,CONCAT16(uVar9,in_stack_fffffffffffffc80)),
                     (cl_command_queue)in_stack_fffffffffffffc78,(cl_event)in_stack_fffffffffffffcb0
                    );
          std::__cxx11::string::~string(local_148);
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
        }
        if ((bVar11 & 1) != 0) {
          pcVar4 = CLIntercept::dispatch(local_40);
          (*pcVar4->clReleaseEvent)(*local_38);
          local_38 = (cl_event *)0x0;
        }
      }
      pSVar5 = CLIntercept::config(local_40);
      if (((((pSVar5->ErrorLogging & 1U) != 0) ||
           (in_stack_fffffffffffffc30.__d.__r = (duration)CLIntercept::config(local_40),
           (((SConfig *)in_stack_fffffffffffffc30.__d.__r)->ErrorAssert & 1U) != 0)) ||
          (in_stack_fffffffffffffc28.__d.__r = (duration)CLIntercept::config(local_40),
          (((SConfig *)in_stack_fffffffffffffc28.__d.__r)->NoErrors & 1U) != 0)) && (local_44 != 0))
      {
        in_stack_fffffffffffffc20.__d.__r = (duration)CLIntercept::config(local_40);
        if (((((CLIntercept *)in_stack_fffffffffffffc20.__d.__r)->m_Mutex).super___mutex_base.
             _M_mutex.__size[0x13] & 1U) != 0) {
          CLIntercept::logError
                    (in_stack_fffffffffffffd80,
                     (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     in_stack_fffffffffffffd74);
        }
        in_stack_fffffffffffffc18.__d.__r = (duration)CLIntercept::config(local_40);
        if ((((SConfig *)in_stack_fffffffffffffc18.__d.__r)->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        in_stack_fffffffffffffc10 = (CLIntercept *)CLIntercept::config(local_40);
        if (((ulong)(in_stack_fffffffffffffc10->m_Dispatch).clCreateSubDevices & 0x100000000) != 0)
        {
          local_44 = 0;
        }
      }
      in_stack_fffffffffffffc08 = CLIntercept::config(local_40);
      if ((in_stack_fffffffffffffc08->LeakChecking & 1U) != 0) {
        in_stack_fffffffffffffc00 = CLIntercept::objectTracker(local_40);
        if (local_38 == (cl_event *)0x0) {
          includeId = 0;
        }
        else {
          includeId = (undefined1)((ulong)*local_38 >> 0x38);
        }
        CObjectTracker::AddAllocation<_cl_event*>
                  (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      }
      in_stack_fffffffffffffbf0 = (CLIntercept *)CLIntercept::config(local_40);
      if (((in_stack_fffffffffffffbf0->m_Mutex).super___mutex_base._M_mutex.__size[3] & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,numEvents,
                   in_stack_fffffffffffffbd8,(cl_sync_point_khr *)in_stack_fffffffffffffbd0);
      }
      pSVar5 = CLIntercept::config(local_40);
      if ((pSVar5->ChromeCallLogging & 1U) != 0) {
        paVar7 = &local_171;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"",paVar7);
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffc10,&in_stack_fffffffffffffc08->SuppressLogging,
                   (string *)in_stack_fffffffffffffc00,(bool)includeId,
                   (uint64_t)in_stack_fffffffffffffbf0,in_stack_fffffffffffffc20,
                   in_stack_fffffffffffffc18);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
      }
      if (local_38 == (cl_event *)0x0) {
        p_Var8 = (cl_event)0x0;
      }
      else {
        p_Var8 = *local_38;
      }
      if ((p_Var8 != (cl_event)0x0) &&
         ((pSVar5 = CLIntercept::config(local_40), (pSVar5->ChromeCallLogging & 1U) != 0 ||
          (in_stack_fffffffffffffbc0 = (CLIntercept *)CLIntercept::config(local_40),
          ((ulong)(in_stack_fffffffffffffbc0->m_Dispatch).clRetainSampler & 0x1000000000000) != 0)))
         ) {
        in_stack_fffffffffffffbb8 = local_40;
        CLIntercept::addEvent
                  (in_stack_fffffffffffffb90,(cl_event)in_stack_fffffffffffffb88,
                   in_stack_fffffffffffffb80);
      }
      std::__cxx11::string::~string(local_70);
    }
    pSVar5 = CLIntercept::config(local_40);
    if ((pSVar5->FinishAfterEnqueue & 1U) == 0) {
      pSVar5 = CLIntercept::config(local_40);
      if ((pSVar5->FlushAfterEnqueue & 1U) != 0) {
        pcVar4 = CLIntercept::dispatch(local_40);
        (*pcVar4->clFlush)((cl_command_queue)local_10);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb60);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb60);
      pSVar5 = CLIntercept::config(local_40);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(local_40), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(local_40), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_190 = std::chrono::_V2::steady_clock::now();
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                ((CLIntercept *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                 (char *)in_stack_fffffffffffffc68,
                 (char *)CONCAT17(in_stack_fffffffffffffc67,
                                  CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)));
      pcVar4 = CLIntercept::dispatch(local_40);
      (*pcVar4->clFinish)((cl_command_queue)local_10);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 (char *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
      pSVar5 = CLIntercept::config(local_40);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(local_40), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(local_40), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        uVar6 = std::chrono::_V2::steady_clock::now();
        pSVar5 = CLIntercept::config(local_40);
        if (((pSVar5->HostPerformanceTiming & 1U) != 0) &&
           (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_40,local_50), bVar2))
        {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xfffffffffffffe30,"",&local_1d1);
          local_1e0 = local_190;
          local_1e8 = uVar6;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffc20.__d.__r,
                     (char *)in_stack_fffffffffffffc18.__d.__r,(string *)in_stack_fffffffffffffc10,
                     in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        }
        pSVar5 = CLIntercept::config(local_40);
        if ((pSVar5->ChromeCallLogging & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_208,"",&local_209);
          local_218 = local_190;
          local_220 = uVar6;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffc10,&in_stack_fffffffffffffc08->SuppressLogging,
                     (string *)in_stack_fffffffffffffc00,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffbf0,in_stack_fffffffffffffc20,
                     in_stack_fffffffffffffc18);
          std::__cxx11::string::~string(local_208);
          std::allocator<char>::~allocator((allocator<char> *)&local_209);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb60);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb60);
      pSVar5 = CLIntercept::config(local_40);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(local_40), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(local_40), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_238 = std::chrono::_V2::steady_clock::now();
        local_228 = local_238;
      }
      CLIntercept::checkTimingEvents(in_stack_000000e8);
      pSVar5 = CLIntercept::config(local_40);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(local_40), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(local_40), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_240 = std::chrono::_V2::steady_clock::now();
        local_230 = local_240;
        pSVar5 = CLIntercept::config(local_40);
        if (((pSVar5->HostPerformanceTiming & 1U) != 0) &&
           (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_40,local_50), bVar2))
        {
          paVar7 = &local_261;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_260,"",paVar7);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffc20.__d.__r,
                     (char *)in_stack_fffffffffffffc18.__d.__r,(string *)in_stack_fffffffffffffc10,
                     in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          std::__cxx11::string::~string(local_260);
          std::allocator<char>::~allocator((allocator<char> *)&local_261);
        }
        pSVar5 = CLIntercept::config(local_40);
        if ((pSVar5->ChromeCallLogging & 1U) != 0) {
          paVar7 = &local_299;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_298,"",paVar7);
          local_2a8 = local_228;
          local_2b0 = local_230;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffc10,&in_stack_fffffffffffffc08->SuppressLogging,
                     (string *)in_stack_fffffffffffffc00,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffbf0,in_stack_fffffffffffffc20,
                     in_stack_fffffffffffffc18);
          std::__cxx11::string::~string(local_298);
          std::allocator<char>::~allocator((allocator<char> *)&local_299);
        }
      }
    }
    pSVar5 = CLIntercept::config(local_40);
    if (((pSVar5->AubCapture & 1U) != 0) &&
       ((pSVar5 = CLIntercept::config(local_40), (pSVar5->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar2 = CLIntercept::checkAubCaptureEnqueueLimits(local_40,local_50), !bVar2)))) {
      CLIntercept::stopAubCapture
                (in_stack_fffffffffffffbc0,(cl_command_queue)in_stack_fffffffffffffbb8);
    }
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueAcquireGLObjects)(
    cl_command_queue command_queue,
    cl_uint num_objects,
    const cl_mem* mem_objects,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    // The cl_khr_gl_sharing APIs and especially clGetGLContextInfoKHR are a
    // special-case: they are extension functions but do not necessarily pass
    // a dispatchable object as their first argument and are implemented in
    // the ICD loader and called into via the ICD dispatch table.  This means
    // that we can install it into our core API dispatch table as well and
    // don't need to look it up per-platform.

    if( pIntercept && pIntercept->dispatch().clEnqueueAcquireGLObjects )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START( command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            const std::string eventWaitListString = getFormattedEventWaitList(
                pIntercept,
                num_events_in_wait_list,
                event_wait_list);

            CALL_LOGGING_ENTER( "queue = %p, num_objects = %u%s",
                command_queue,
                num_objects,
                eventWaitListString.c_str() );
            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

            retVal = pIntercept->dispatch().clEnqueueAcquireGLObjects(
                command_queue,
                num_objects,
                mem_objects,
                num_events_in_wait_list,
                event_wait_list,
                event);

            HOST_PERFORMANCE_TIMING_END();
            DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}